

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Bitvec.cpp
# Opt level: O2

void lrot32(void *blob,int len,int c)

{
  undefined4 uVar1;
  byte bVar2;
  int nbytes;
  uint uVar3;
  int iVar4;
  uint uVar5;
  ulong uVar6;
  
  if (c != 0) {
    uVar3 = len / 4 - 1;
    for (uVar5 = 0; uVar5 != (~(c / 0x20 >> 0x1f) & c / 0x20); uVar5 = uVar5 + 1) {
      uVar1 = *(undefined4 *)((long)blob + (long)(int)uVar3 * 4);
      for (uVar6 = (ulong)uVar3; 0 < (int)uVar6; uVar6 = uVar6 - 1) {
        *(undefined4 *)((long)blob + uVar6 * 4) = *(undefined4 *)((long)blob + uVar6 * 4 + -4);
      }
      *(undefined4 *)blob = uVar1;
    }
    if ((c & 0x1fU) != 0) {
      uVar5 = *(uint *)((long)blob + (long)(int)uVar3 * 4);
      uVar6 = (ulong)uVar3;
      while (iVar4 = (int)uVar6, -1 < iVar4) {
        uVar3 = uVar5;
        if (iVar4 != 0) {
          uVar3 = *(uint *)((long)blob + uVar6 * 4 + -4);
        }
        bVar2 = (byte)c & 0x1f;
        *(uint *)((long)blob + uVar6 * 4) =
             *(int *)((long)blob + uVar6 * 4) << bVar2 | uVar3 >> 0x20 - bVar2;
        uVar6 = (ulong)(iVar4 - 1);
      }
    }
  }
  return;
}

Assistant:

void lrot32 ( void * blob, int len, int c )
{
  assert((len & 3) == 0);

  int nbytes  = len;
  int ndwords = nbytes/4;

  uint32_t * k = (uint32_t*)blob;

  if(c == 0) return;

  //----------

  int b = c / 32;
  c &= (32-1);

  for(int j = 0; j < b; j++)
  {
    uint32_t t = k[ndwords-1];

    for(int i = ndwords-1; i > 0; i--)
    {
      k[i] = k[i-1];
    }

    k[0] = t;
  }

  uint32_t t = k[ndwords-1];

  if(c == 0) return;

  for(int i = ndwords-1; i >= 0; i--)
  {
    uint32_t a = k[i];
    uint32_t b = (i == 0) ? t : k[i-1];

    k[i] = (a << c) | (b >> (32-c));
  }
}